

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkeletonMeshBuilder.cpp
# Opt level: O0

void __thiscall Assimp::SkeletonMeshBuilder::CreateGeometry(SkeletonMeshBuilder *this,aiNode *pNode)

{
  float *__x;
  aiNode *paVar1;
  undefined1 auVar2 [16];
  aiVector3t<float> aVar3;
  aiVector3t<float> aVar4;
  aiVector3t<float> aVar5;
  aiVector3t<float> aVar6;
  aiVector3t<float> aVar7;
  aiVector3t<float> aVar8;
  aiVector3t<float> aVar9;
  aiVector3t<float> aVar10;
  aiVector3t<float> aVar11;
  aiVector3t<float> aVar12;
  aiVector3t<float> aVar13;
  aiVector3t<float> aVar14;
  aiVector3t<float> aVar15;
  size_type sVar16;
  aiVector3t<float> *paVar17;
  aiBone *this_00;
  aiMatrix4x4t<float> *paVar18;
  ulong uVar19;
  ulong uVar20;
  aiVertexWeight *paVar21;
  reference pvVar22;
  double dVar23;
  undefined1 auVar24 [16];
  aiVector3t<float> aVar25;
  aiVertexWeight *local_7c0;
  uint local_67c;
  undefined4 uStack_678;
  uint a_3;
  float local_670;
  uint local_658;
  uint a_2;
  undefined1 local_614 [8];
  aiMatrix4x4 boneToMeshTransform;
  uint local_5cc;
  uint a_1;
  aiMatrix4x4t<float> local_588;
  aiNode *local_548;
  aiNode *parent;
  aiBone *local_500;
  aiBone *bone;
  uint numVertices;
  Face local_4e4;
  Face local_4d8;
  Face local_4cc;
  Face local_4c0;
  Face local_4b4;
  Face local_4a8;
  Face local_49c;
  aiVector3t<float> local_490;
  aiVector3t<float> local_484;
  aiVector3t<float> local_478;
  aiVector3t<float> local_46c;
  aiVector3t<float> local_460;
  aiVector3t<float> local_454;
  aiVector3t<float> local_448;
  aiVector3t<float> local_43c;
  aiVector3t<float> local_430;
  aiVector3t<float> local_424;
  aiVector3t<float> local_418;
  aiVector3t<float> local_40c;
  aiVector3t<float> local_400;
  aiVector3t<float> local_3f4;
  aiVector3t<float> local_3e8;
  aiVector3t<float> local_3dc;
  aiVector3t<float> local_3d0;
  aiVector3t<float> local_3c4;
  aiVector3t<float> local_3b8;
  aiVector3t<float> local_3ac;
  aiVector3t<float> local_3a0;
  aiVector3t<float> local_394;
  aiVector3t<float> local_388;
  aiVector3t<float> local_37c;
  float local_370;
  undefined1 local_36c [4];
  ai_real sizeEstimate;
  aiVector3D ownpos;
  Face local_354;
  Face local_348;
  Face local_33c;
  aiVector3t<float> local_330;
  aiVector3t<float> local_320;
  aiVector3t<float> local_310;
  aiVector3t<float> local_300;
  aiVector3t<float> local_2f0;
  value_type local_2e4;
  aiVector3t<float> local_2d8;
  aiVector3t<float> local_2c8;
  aiVector3t<float> local_2b8;
  value_type local_2a8;
  aiVector3t<float> local_298;
  aiVector3t<float> local_288;
  aiVector3t<float> local_278;
  value_type local_268;
  aiVector3t<float> local_258;
  aiVector3t<float> local_248;
  aiVector3t<float> local_238;
  value_type local_228;
  aiVector3t<float> local_218;
  aiVector3t<float> local_208;
  aiVector3t<float> local_1f8;
  value_type local_1e8;
  aiVector3t<float> local_1d8;
  aiVector3t<float> local_1c8;
  aiVector3t<float> local_1b8;
  aiVector3t<float> local_1a8;
  aiVector3t<float> local_198;
  value_type local_188;
  aiVector3t<float> local_178;
  aiVector3t<float> local_168;
  aiVector3t<float> local_158;
  aiVector3t<float> local_148;
  aiVector3t<float> local_138;
  value_type local_128;
  aiVector3t<float> local_118;
  aiVector3t<float> local_108;
  aiVector3t<float> local_f8;
  aiVector3t<float> local_e8;
  aiVector3t<float> local_d8;
  value_type local_c8;
  uint local_bc;
  float fStack_b8;
  uint localVertexStart;
  float local_b0;
  aiVector3t<float> local_a8;
  undefined1 local_98 [8];
  aiVector3D side;
  float fStack_84;
  float local_80;
  aiVector3t<float> local_78;
  undefined1 local_68 [8];
  aiVector3D front;
  aiVector3D orth;
  undefined1 local_44 [8];
  aiVector3D up;
  ai_real distanceToChild;
  aiVector3D childpos;
  aiMatrix4x4 *childTransform;
  uint a;
  uint vertexStartIndex;
  aiNode *pNode_local;
  SkeletonMeshBuilder *this_local;
  undefined1 extraout_var [12];
  
  sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                     (&this->mVertices);
  aVar15.z = local_138.z;
  aVar15.x = local_138.x;
  aVar15.y = local_138.y;
  aVar14.z = local_198.z;
  aVar14.x = local_198.x;
  aVar14.y = local_198.y;
  aVar13.z = local_1f8.z;
  aVar13.x = local_1f8.x;
  aVar13.y = local_1f8.y;
  aVar12.z = local_238.z;
  aVar12.x = local_238.x;
  aVar12.y = local_238.y;
  aVar11.z = local_278.z;
  aVar11.x = local_278.x;
  aVar11.y = local_278.y;
  aVar10.z = local_2b8.z;
  aVar10.x = local_2b8.x;
  aVar10.y = local_2b8.y;
  aVar9.z = local_2f0.z;
  aVar9.x = local_2f0.x;
  aVar9.y = local_2f0.y;
  aVar8.z = local_168.z;
  aVar8.x = local_168.x;
  aVar8.y = local_168.y;
  aVar7.z = local_1c8.z;
  aVar7.x = local_1c8.x;
  aVar7.y = local_1c8.y;
  aVar6.z = local_208.z;
  aVar6.x = local_208.x;
  aVar6.y = local_208.y;
  aVar5.z = local_248.z;
  aVar5.x = local_248.x;
  aVar5.y = local_248.y;
  aVar4.z = local_288.z;
  aVar4.x = local_288.x;
  aVar4.y = local_288.y;
  aVar3.z = local_2c8.z;
  aVar3.x = local_2c8.x;
  aVar3.y = local_2c8.y;
  aVar25.z = local_320.z;
  aVar25.x = local_320.x;
  aVar25.y = local_320.y;
  local_658 = (uint)sVar16;
  if ((pNode->mNumChildren == 0) || ((this->mKnobsOnly & 1U) != 0)) {
    aiVector3t<float>::aiVector3t
              ((aiVector3t<float> *)local_36c,(pNode->mTransformation).a4,
               (pNode->mTransformation).b4,(pNode->mTransformation).c4);
    local_370 = aiVector3t<float>::Length((aiVector3t<float> *)local_36c);
    local_370 = local_370 * 0.18;
    aiVector3t<float>::aiVector3t(&local_37c,-local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_37c);
    aiVector3t<float>::aiVector3t(&local_388,0.0,local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_388);
    aiVector3t<float>::aiVector3t(&local_394,0.0,0.0,-local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_394);
    aiVector3t<float>::aiVector3t(&local_3a0,0.0,local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3a0);
    aiVector3t<float>::aiVector3t(&local_3ac,local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3ac);
    aiVector3t<float>::aiVector3t(&local_3b8,0.0,0.0,-local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3b8);
    aiVector3t<float>::aiVector3t(&local_3c4,local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3c4);
    aiVector3t<float>::aiVector3t(&local_3d0,0.0,-local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3d0);
    aiVector3t<float>::aiVector3t(&local_3dc,0.0,0.0,-local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3dc);
    aiVector3t<float>::aiVector3t(&local_3e8,0.0,-local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3e8);
    aiVector3t<float>::aiVector3t(&local_3f4,-local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_3f4);
    aiVector3t<float>::aiVector3t(&local_400,0.0,0.0,-local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_400);
    aiVector3t<float>::aiVector3t(&local_40c,-local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_40c);
    aiVector3t<float>::aiVector3t(&local_418,0.0,0.0,local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_418);
    aiVector3t<float>::aiVector3t(&local_424,0.0,local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_424);
    aiVector3t<float>::aiVector3t(&local_430,0.0,local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_430);
    aiVector3t<float>::aiVector3t(&local_43c,0.0,0.0,local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_43c);
    aiVector3t<float>::aiVector3t(&local_448,local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_448);
    aiVector3t<float>::aiVector3t(&local_454,local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_454);
    aiVector3t<float>::aiVector3t(&local_460,0.0,0.0,local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_460);
    aiVector3t<float>::aiVector3t(&local_46c,0.0,-local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_46c);
    aiVector3t<float>::aiVector3t(&local_478,0.0,-local_370,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_478);
    aiVector3t<float>::aiVector3t(&local_484,0.0,0.0,local_370);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_484);
    aiVector3t<float>::aiVector3t(&local_490,-local_370,0.0,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (&this->mVertices,&local_490);
    Face::Face(&local_49c,local_658,local_658 + 1,local_658 + 2);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_49c);
    Face::Face(&local_4a8,local_658 + 3,local_658 + 4,local_658 + 5);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_4a8);
    Face::Face(&local_4b4,local_658 + 6,local_658 + 7,local_658 + 8);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_4b4);
    Face::Face(&local_4c0,local_658 + 9,local_658 + 10,local_658 + 0xb);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_4c0);
    Face::Face(&local_4cc,local_658 + 0xc,local_658 + 0xd,local_658 + 0xe);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_4cc);
    Face::Face(&local_4d8,local_658 + 0xf,local_658 + 0x10,local_658 + 0x11);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_4d8);
    Face::Face(&local_4e4,local_658 + 0x12,local_658 + 0x13,local_658 + 0x14);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,&local_4e4);
    Face::Face((Face *)&stack0xfffffffffffffb10,local_658 + 0x15,local_658 + 0x16,local_658 + 0x17);
    std::
    vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>::
    push_back(&this->mFaces,(value_type *)&stack0xfffffffffffffb10);
  }
  else {
    local_320 = aVar25;
    local_2c8 = aVar3;
    local_288 = aVar4;
    local_248 = aVar5;
    local_208 = aVar6;
    local_1c8 = aVar7;
    local_168 = aVar8;
    local_2f0 = aVar9;
    local_2b8 = aVar10;
    local_278 = aVar11;
    local_238 = aVar12;
    local_1f8 = aVar13;
    local_198 = aVar14;
    local_138 = aVar15;
    for (childTransform._0_4_ = 0; (uint)childTransform < pNode->mNumChildren;
        childTransform._0_4_ = (uint)childTransform + 1) {
      paVar1 = pNode->mChildren[(uint)childTransform];
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&up.z,(paVar1->mTransformation).a4,
                 (paVar1->mTransformation).b4,(paVar1->mTransformation).c4);
      up.y = aiVector3t<float>::Length((aiVector3t<float> *)&up.z);
      if (0.0001 <= up.y) {
        orth.y = up.z;
        orth.z = distanceToChild;
        paVar17 = aiVector3t<float>::Normalize((aiVector3t<float> *)&orth.y);
        local_44._0_4_ = paVar17->x;
        local_44._4_4_ = paVar17->y;
        up.x = paVar17->z;
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&front.y,1.0,0.0,0.0);
        auVar24._0_4_ = ::operator*((aiVector3t<float> *)&front.y,(aiVector3t<float> *)local_44);
        auVar24._4_12_ = extraout_var;
        dVar23 = std::fabs(auVar24._0_8_);
        if (0.99 < SUB84(dVar23,0)) {
          aiVector3t<float>::Set((aiVector3t<float> *)&front.y,0.0,1.0,0.0);
        }
        aVar25 = operator^((aiVector3t<float> *)local_44,(aiVector3t<float> *)&front.y);
        local_80 = aVar25.z;
        local_78.z = local_80;
        stack0xffffffffffffff78 = aVar25._0_8_;
        local_78.x = side.z;
        local_78.y = fStack_84;
        unique0x1000233c = aVar25;
        paVar17 = aiVector3t<float>::Normalize(&local_78);
        front.x = paVar17->z;
        local_68._0_4_ = paVar17->x;
        local_68._4_4_ = paVar17->y;
        aVar25 = operator^((aiVector3t<float> *)local_68,(aiVector3t<float> *)local_44);
        local_b0 = aVar25.z;
        local_a8.z = local_b0;
        _fStack_b8 = aVar25._0_8_;
        local_a8.x = fStack_b8;
        local_a8.y = (float)localVertexStart;
        _fStack_b8 = aVar25;
        paVar17 = aiVector3t<float>::Normalize(&local_a8);
        side.x = paVar17->z;
        local_98._0_4_ = paVar17->x;
        local_98._4_4_ = paVar17->y;
        sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           (&this->mVertices);
        local_bc = (uint)sVar16;
        aVar25 = ::operator-((aiVector3t<float> *)local_68);
        local_f8.z = aVar25.z;
        local_e8.z = local_f8.z;
        local_f8._0_8_ = aVar25._0_8_;
        local_e8.x = local_f8.x;
        local_e8.y = local_f8.y;
        local_f8 = aVar25;
        aVar25 = ::operator*(&local_e8,up.y);
        local_108.z = aVar25.z;
        local_d8.z = local_108.z;
        local_108._0_8_ = aVar25._0_8_;
        local_d8.x = local_108.x;
        local_d8.y = local_108.y;
        local_108 = aVar25;
        aVar25 = ::operator*(&local_d8,0.1);
        local_118.z = aVar25.z;
        local_c8.z = local_118.z;
        local_118._0_8_ = aVar25._0_8_;
        local_c8.x = local_118.x;
        local_c8.y = local_118.y;
        local_118 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_c8);
        __x = &up.z;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,(value_type *)__x);
        aVar25 = ::operator-((aiVector3t<float> *)local_98);
        local_158.z = aVar25.z;
        local_148.z = local_158.z;
        local_158._0_8_ = aVar25._0_8_;
        local_148.x = local_158.x;
        local_148.y = local_158.y;
        local_158 = aVar25;
        aVar25 = ::operator*(&local_148,up.y);
        local_168 = aVar25;
        local_138 = aVar25;
        aVar25 = ::operator*(&local_138,0.1);
        local_178.z = aVar25.z;
        local_128.z = local_178.z;
        local_178._0_8_ = aVar25._0_8_;
        local_128.x = local_178.x;
        local_128.y = local_178.y;
        local_178 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_128);
        aVar25 = ::operator-((aiVector3t<float> *)local_98);
        local_1b8.z = aVar25.z;
        local_1a8.z = local_1b8.z;
        local_1b8._0_8_ = aVar25._0_8_;
        local_1a8.x = local_1b8.x;
        local_1a8.y = local_1b8.y;
        local_1b8 = aVar25;
        aVar25 = ::operator*(&local_1a8,up.y);
        local_1c8 = aVar25;
        local_198 = aVar25;
        aVar25 = ::operator*(&local_198,0.1);
        local_1d8.z = aVar25.z;
        local_188.z = local_1d8.z;
        local_1d8._0_8_ = aVar25._0_8_;
        local_188.x = local_1d8.x;
        local_188.y = local_1d8.y;
        local_1d8 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_188);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,(value_type *)__x);
        aVar25 = ::operator*((aiVector3t<float> *)local_68,up.y);
        local_208 = aVar25;
        local_1f8 = aVar25;
        aVar25 = ::operator*(&local_1f8,0.1);
        local_218.z = aVar25.z;
        local_1e8.z = local_218.z;
        local_218._0_8_ = aVar25._0_8_;
        local_1e8.x = local_218.x;
        local_1e8.y = local_218.y;
        local_218 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_1e8);
        aVar25 = ::operator*((aiVector3t<float> *)local_68,up.y);
        local_248 = aVar25;
        local_238 = aVar25;
        aVar25 = ::operator*(&local_238,0.1);
        local_258.z = aVar25.z;
        local_228.z = local_258.z;
        local_258._0_8_ = aVar25._0_8_;
        local_228.x = local_258.x;
        local_228.y = local_258.y;
        local_258 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_228);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,(value_type *)__x);
        aVar25 = ::operator*((aiVector3t<float> *)local_98,up.y);
        local_288 = aVar25;
        local_278 = aVar25;
        aVar25 = ::operator*(&local_278,0.1);
        local_298.z = aVar25.z;
        local_268.z = local_298.z;
        local_298._0_8_ = aVar25._0_8_;
        local_268.x = local_298.x;
        local_268.y = local_298.y;
        local_298 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_268);
        aVar25 = ::operator*((aiVector3t<float> *)local_98,up.y);
        local_2c8 = aVar25;
        local_2b8 = aVar25;
        aVar25 = ::operator*(&local_2b8,0.1);
        local_2d8.z = aVar25.z;
        local_2a8.z = local_2d8.z;
        local_2d8._0_8_ = aVar25._0_8_;
        local_2a8.x = local_2d8.x;
        local_2a8.y = local_2d8.y;
        local_2d8 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_2a8);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,(value_type *)__x);
        aVar25 = ::operator-((aiVector3t<float> *)local_68);
        local_310.z = aVar25.z;
        local_300.z = local_310.z;
        local_310._0_8_ = aVar25._0_8_;
        local_300.x = local_310.x;
        local_300.y = local_310.y;
        local_310 = aVar25;
        aVar25 = ::operator*(&local_300,up.y);
        local_320 = aVar25;
        local_2f0 = aVar25;
        aVar25 = ::operator*(&local_2f0,0.1);
        local_330._0_8_ = aVar25._0_8_;
        local_2e4.x = local_330.x;
        local_2e4.y = local_330.y;
        local_330.z = aVar25.z;
        local_2e4.z = local_330.z;
        local_330 = aVar25;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this->mVertices,&local_2e4);
        Face::Face(&local_33c,local_bc,local_bc + 1,local_bc + 2);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::push_back(&this->mFaces,&local_33c);
        Face::Face(&local_348,local_bc + 3,local_bc + 4,local_bc + 5);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::push_back(&this->mFaces,&local_348);
        Face::Face(&local_354,local_bc + 6,local_bc + 7,local_bc + 8);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::push_back(&this->mFaces,&local_354);
        Face::Face((Face *)&ownpos.y,local_bc + 9,local_bc + 10,local_bc + 0xb);
        std::
        vector<Assimp::SkeletonMeshBuilder::Face,_std::allocator<Assimp::SkeletonMeshBuilder::Face>_>
        ::push_back(&this->mFaces,(value_type *)&ownpos.y);
      }
    }
  }
  sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                     (&this->mVertices);
  bone._4_4_ = (int)sVar16 - local_658;
  if (bone._4_4_ != 0) {
    this_00 = (aiBone *)operator_new(0x460);
    aiBone::aiBone(this_00);
    local_500 = this_00;
    std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(&this->mBones,&local_500);
    aiString::operator=(&local_500->mName,&pNode->mName);
    memcpy(&parent,&pNode->mTransformation,0x40);
    paVar18 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&parent);
    memcpy(&local_500->mOffsetMatrix,paVar18,0x40);
    for (local_548 = pNode->mParent; local_548 != (aiNode *)0x0; local_548 = local_548->mParent) {
      memcpy(&stack0xfffffffffffffa38,&local_548->mTransformation,0x40);
      paVar18 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&stack0xfffffffffffffa38);
      aiMatrix4x4t<float>::operator*(&local_588,paVar18,&local_500->mOffsetMatrix);
      memcpy(&local_500->mOffsetMatrix,&local_588,0x40);
    }
    local_500->mNumWeights = bone._4_4_;
    uVar19 = CONCAT44(0,bone._4_4_);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar19;
    uVar20 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar20 = 0xffffffffffffffff;
    }
    paVar21 = (aiVertexWeight *)operator_new__(uVar20);
    if (uVar19 != 0) {
      local_7c0 = paVar21;
      do {
        aiVertexWeight::aiVertexWeight(local_7c0);
        local_7c0 = local_7c0 + 1;
      } while (local_7c0 != paVar21 + uVar19);
    }
    local_500->mWeights = paVar21;
    for (local_5cc = 0; local_5cc < bone._4_4_; local_5cc = local_5cc + 1) {
      aiVertexWeight::aiVertexWeight
                ((aiVertexWeight *)&boneToMeshTransform.d3,local_658 + local_5cc,1.0);
      paVar21 = local_500->mWeights;
      paVar21[local_5cc].mVertexId = (uint)boneToMeshTransform.d3;
      paVar21[local_5cc].mWeight = boneToMeshTransform.d4;
    }
    memcpy(&stack0xfffffffffffff9ac,&local_500->mOffsetMatrix,0x40);
    paVar18 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&stack0xfffffffffffff9ac);
    memcpy(local_614,paVar18,0x40);
    while( true ) {
      sVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         (&this->mVertices);
      if (sVar16 <= local_658) break;
      pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          (&this->mVertices,(ulong)local_658);
      aVar25 = ::operator*((aiMatrix4x4t<float> *)local_614,pvVar22);
      _uStack_678 = aVar25._0_8_;
      local_670 = aVar25.z;
      pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                          (&this->mVertices,(ulong)local_658);
      pvVar22->x = (float)uStack_678;
      pvVar22->y = (float)a_3;
      pvVar22->z = local_670;
      local_658 = local_658 + 1;
    }
  }
  for (local_67c = 0; local_67c < pNode->mNumChildren; local_67c = local_67c + 1) {
    CreateGeometry(this,pNode->mChildren[local_67c]);
  }
  return;
}

Assistant:

void SkeletonMeshBuilder::CreateGeometry( const aiNode* pNode)
{
    // add a joint entry for the node.
    const unsigned int vertexStartIndex = static_cast<unsigned int>(mVertices.size());

    // now build the geometry.
    if( pNode->mNumChildren > 0 && !mKnobsOnly)
    {
        // If the node has children, we build little pointers to each of them
        for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        {
            // find a suitable coordinate system
            const aiMatrix4x4& childTransform = pNode->mChildren[a]->mTransformation;
            aiVector3D childpos( childTransform.a4, childTransform.b4, childTransform.c4);
            ai_real distanceToChild = childpos.Length();
            if( distanceToChild < 0.0001)
                continue;
            aiVector3D up = aiVector3D( childpos).Normalize();

            aiVector3D orth( 1.0, 0.0, 0.0);
            if( std::fabs( orth * up) > 0.99)
                orth.Set( 0.0, 1.0, 0.0);

            aiVector3D front = (up ^ orth).Normalize();
            aiVector3D side = (front ^ up).Normalize();

            unsigned int localVertexStart = static_cast<unsigned int>(mVertices.size());
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( -side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( front * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( side * distanceToChild * (ai_real)0.1);
            mVertices.push_back( childpos);
            mVertices.push_back( -front * distanceToChild * (ai_real)0.1);

            mFaces.push_back( Face( localVertexStart + 0, localVertexStart + 1, localVertexStart + 2));
            mFaces.push_back( Face( localVertexStart + 3, localVertexStart + 4, localVertexStart + 5));
            mFaces.push_back( Face( localVertexStart + 6, localVertexStart + 7, localVertexStart + 8));
            mFaces.push_back( Face( localVertexStart + 9, localVertexStart + 10, localVertexStart + 11));
        }
    }
    else
    {
        // if the node has no children, it's an end node. Put a little knob there instead
        aiVector3D ownpos( pNode->mTransformation.a4, pNode->mTransformation.b4, pNode->mTransformation.c4);
        ai_real sizeEstimate = ownpos.Length() * ai_real( 0.18 );

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, -sizeEstimate));

        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( sizeEstimate, 0.0, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, -sizeEstimate, 0.0));
        mVertices.push_back( aiVector3D( 0.0, 0.0, sizeEstimate));
        mVertices.push_back( aiVector3D( -sizeEstimate, 0.0, 0.0));

        mFaces.push_back( Face( vertexStartIndex + 0, vertexStartIndex + 1, vertexStartIndex + 2));
        mFaces.push_back( Face( vertexStartIndex + 3, vertexStartIndex + 4, vertexStartIndex + 5));
        mFaces.push_back( Face( vertexStartIndex + 6, vertexStartIndex + 7, vertexStartIndex + 8));
        mFaces.push_back( Face( vertexStartIndex + 9, vertexStartIndex + 10, vertexStartIndex + 11));
        mFaces.push_back( Face( vertexStartIndex + 12, vertexStartIndex + 13, vertexStartIndex + 14));
        mFaces.push_back( Face( vertexStartIndex + 15, vertexStartIndex + 16, vertexStartIndex + 17));
        mFaces.push_back( Face( vertexStartIndex + 18, vertexStartIndex + 19, vertexStartIndex + 20));
        mFaces.push_back( Face( vertexStartIndex + 21, vertexStartIndex + 22, vertexStartIndex + 23));
    }

    unsigned int numVertices = static_cast<unsigned int>(mVertices.size() - vertexStartIndex);
    if( numVertices > 0)
    {
        // create a bone affecting all the newly created vertices
        aiBone* bone = new aiBone;
        mBones.push_back( bone);
        bone->mName = pNode->mName;

        // calculate the bone offset matrix by concatenating the inverse transformations of all parents
        bone->mOffsetMatrix = aiMatrix4x4( pNode->mTransformation).Inverse();
        for( aiNode* parent = pNode->mParent; parent != NULL; parent = parent->mParent)
            bone->mOffsetMatrix = aiMatrix4x4( parent->mTransformation).Inverse() * bone->mOffsetMatrix;

        // add all the vertices to the bone's influences
        bone->mNumWeights = numVertices;
        bone->mWeights = new aiVertexWeight[numVertices];
        for( unsigned int a = 0; a < numVertices; a++)
            bone->mWeights[a] = aiVertexWeight( vertexStartIndex + a, 1.0);

        // HACK: (thom) transform all vertices to the bone's local space. Should be done before adding
        // them to the array, but I'm tired now and I'm annoyed.
        aiMatrix4x4 boneToMeshTransform = aiMatrix4x4( bone->mOffsetMatrix).Inverse();
        for( unsigned int a = vertexStartIndex; a < mVertices.size(); a++)
            mVertices[a] = boneToMeshTransform * mVertices[a];
    }

    // and finally recurse into the children list
    for( unsigned int a = 0; a < pNode->mNumChildren; a++)
        CreateGeometry( pNode->mChildren[a]);
}